

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zgsitrf.c
# Opt level: O2

void zgsitrf(superlu_options_t *options,SuperMatrix *A,int relax,int panel_size,int *etree,
            void *work,int_t lwork,int *perm_c,int *perm_r,SuperMatrix *L,SuperMatrix *U,
            GlobalLU_t *Glu,SuperLUStat_t *stat,int_t *info)

{
  undefined8 *puVar1;
  uint n;
  int_t *piVar2;
  int_t *piVar3;
  int_t *xa_end;
  superlu_options_t *psVar4;
  SuperMatrix *pSVar5;
  long lVar6;
  byte bVar7;
  int_t iVar8;
  int iVar9;
  int_t iVar10;
  int iVar11;
  ulong uVar12;
  double *amax;
  byte bVar13;
  byte bVar14;
  int iVar15;
  ulong uVar16;
  int *piVar17;
  uint uVar18;
  uint jcol;
  ulong uVar19;
  doublecomplex *z;
  int iVar20;
  int *piVar21;
  int *piVar22;
  long lVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined4 uVar27;
  undefined4 uVar28;
  uint local_284;
  int local_274;
  int nnzLj;
  int *local_268;
  double local_260;
  int pivrow;
  ulong local_250;
  uint local_244;
  double local_240;
  double local_238;
  int_t *local_230;
  int_t nnzL;
  int usepr;
  int nseg;
  ulong local_218;
  double local_210;
  int *local_208;
  int_t *local_200;
  int *marker;
  int *local_1f0;
  double fill_tol;
  uint local_1e0;
  fact_t local_1dc;
  int local_1d8;
  int nseg1;
  double *local_1d0;
  long local_1c8;
  double local_1c0;
  doublecomplex *dense;
  int *repfnz;
  int *segrep;
  double local_1a0;
  int_t *local_198;
  int *local_190;
  int *local_188;
  doublecomplex *tempv;
  int local_178;
  int nnzUj;
  int_t nnzU;
  int_t nzlumax;
  int *local_168;
  double local_160;
  int *local_158;
  double local_150;
  int *local_148;
  ulong local_140;
  int *local_138;
  ulong local_130;
  int_t *local_128;
  double local_120;
  int *local_118;
  ulong local_110;
  doublecomplex local_108;
  long local_f0;
  superlu_options_t *local_e8;
  int_t *local_e0;
  int_t *local_d8;
  int_t *local_d0;
  int_t *xplore;
  SuperMatrix *local_c0;
  double local_b8;
  double local_b0;
  int_t *local_a8;
  flops_t *local_a0;
  int *local_98;
  double local_90;
  int *panel_lsub;
  int *parent;
  doublecomplex *zwork;
  int *iwork;
  long local_68;
  int *local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  int_t *xprune;
  
  local_140 = (ulong)(uint)panel_size;
  local_90 = options->DiagPivotThresh;
  local_150 = options->ILU_DropTol;
  local_1c0 = options->ILU_FillTol;
  uVar18 = A->nrow;
  local_250 = (ulong)uVar18;
  n = A->ncol;
  local_244 = n;
  if ((int)uVar18 < (int)n) {
    local_244 = uVar18;
  }
  local_260 = options->ILU_FillFactor;
  local_1dc = options->Fact;
  local_130 = (ulong)(uint)options->ILU_DropRule;
  local_110 = (ulong)options->ILU_MILU;
  local_98 = stat->panel_histo;
  local_a0 = stat->ops;
  piVar2 = (int_t *)A->Store;
  local_40 = *(long *)(piVar2 + 2);
  piVar3 = *(int_t **)(piVar2 + 4);
  local_200 = *(int_t **)(piVar2 + 6);
  xa_end = *(int_t **)(piVar2 + 8);
  local_268 = etree;
  iVar8 = zLUMemInit(local_1dc,work,lwork,uVar18,n,*piVar2,panel_size,local_260,L,U,Glu,&iwork,
                     &zwork);
  uVar16 = local_250;
  *info = iVar8;
  if (iVar8 != 0) {
    return;
  }
  local_218 = (ulong)(int)n;
  local_148 = Glu->xsup;
  local_138 = Glu->supno;
  local_198 = Glu->xlsub;
  local_e0 = Glu->xlusup;
  local_d0 = Glu->xusub;
  iVar11 = (int)local_250;
  iVar9 = (int)local_140;
  local_230 = piVar2;
  local_e8 = options;
  local_c0 = A;
  SetIWork(iVar11,n,iVar9,iwork,&segrep,&parent,&xplore,&repfnz,&panel_lsub,&xprune,&marker);
  local_190 = int32Malloc(iVar11);
  superlu_free(xprune);
  zSetRWork(iVar11,iVar9,zwork,&dense,&tempv);
  uVar19 = 0;
  usepr = (int)(local_1dc == SamePattern_SameRowPerm);
  if (local_1dc == SamePattern_SameRowPerm) {
    local_188 = int32Malloc(iVar11);
    uVar12 = 0;
    if (0 < iVar11) {
      uVar12 = uVar16 & 0xffffffff;
    }
    for (uVar16 = 0; uVar12 != uVar16; uVar16 = uVar16 + 1) {
      local_188[perm_r[uVar16]] = (int)uVar16;
    }
  }
  else {
    local_188 = (int *)0x0;
  }
  local_f0 = (long)iVar11;
  local_118 = int32Malloc(n);
  uVar16 = 0;
  if (0 < (int)local_218) {
    uVar16 = local_218 & 0xffffffff;
  }
  for (; uVar16 != uVar19; uVar19 = uVar19 + 1) {
    local_118[perm_c[uVar19]] = (int)uVar19;
  }
  local_128 = intMalloc(n);
  uVar18 = local_244;
  for (uVar19 = 0; uVar16 != uVar19; uVar19 = uVar19 + 1) {
    local_128[uVar19] = local_118[uVar19];
  }
  local_d8 = intMalloc((int_t)local_218);
  for (uVar19 = 0; uVar16 != uVar19; uVar19 = uVar19 + 1) {
    local_d8[uVar19] = perm_c[uVar19];
  }
  amax = (double *)superlu_malloc((long)(int)local_140 << 3);
  if ((local_130 & 0xe) == 0) {
    local_1d0 = (double *)0x0;
  }
  else {
    local_1d0 = (double *)superlu_malloc(local_218 * 8);
  }
  nnzLj = 0;
  nnzUj = 0;
  iVar9 = sp_ienv(7);
  local_120 = (double)(int)uVar18;
  local_1d8 = (int)(local_120 * 0.95);
  if (local_1d8 < (int)(uVar18 + iVar9 * -2)) {
    iVar9 = sp_ienv(7);
    local_1d8 = uVar18 + iVar9 * -2;
  }
  psVar4 = local_e8;
  dVar24 = pow((double)(int)n,-1.0 / local_e8->ILU_MILU_Dim);
  iVar8 = (int_t)local_218;
  local_158 = intMalloc(iVar8);
  local_a8 = intMalloc(n);
  piVar21 = local_158;
  if (psVar4->SymmetricMode == YES) {
    ilu_heap_relax_snode(iVar8,local_268,relax,marker,local_158,local_a8);
  }
  else {
    ilu_relax_snode(n,local_268,relax,marker,local_158,local_a8);
  }
  iVar9 = (int)local_250;
  ifill(perm_r,iVar9,-1);
  ifill(marker,iVar9 * 3,-1);
  piVar22 = local_190;
  *local_138 = -1;
  *local_e0 = 0;
  *local_d0 = 0;
  *local_198 = 0;
  *local_148 = 0;
  ifill(local_190,iVar9,-1);
  mark_relax(iVar9,piVar21,local_a8,local_200,xa_end,piVar3,piVar22);
  local_240 = (double)iVar9;
  local_178 = n * iVar9;
  auVar26._0_4_ = -(uint)((local_130 & 0x10) == 0);
  auVar26._4_4_ = -(uint)((local_130 & 8) == 0);
  auVar26._8_4_ = -(uint)((local_130 & 4) == 0);
  auVar26._12_4_ = -(uint)((local_130 & 2) == 0);
  local_1e0 = movmskps(local_178,auVar26);
  bVar7 = (byte)local_1e0;
  bVar13 = (bVar7 & 2) >> 1;
  bVar14 = (bVar7 & 4) >> 2;
  bVar7 = bVar7 >> 3;
  local_50 = local_f0 * 2;
  uVar27 = SUB84(local_260,0);
  uVar28 = (undefined4)((ulong)local_260 >> 0x20);
  local_b8 = local_260 * 0.9;
  local_b0 = (1.0 - dVar24) + (1.0 - dVar24);
  local_58 = (long)local_1d8;
  local_60 = piVar21 + 1;
  uVar16 = 0;
  local_238 = local_150;
  local_1a0 = local_150;
  local_48 = (long)(int)local_50;
  local_274 = 0;
  piVar21 = (int *)0x0;
LAB_0010a129:
  local_284 = (uint)uVar16;
  while( true ) {
    pSVar5 = local_c0;
    uVar18 = local_244;
    iVar9 = (int)piVar21;
    if (local_244 - iVar9 == 0 || (int)local_244 < iVar9) {
      *info = local_274;
      if ((int)local_218 < (int)local_250) {
        uVar19 = 0;
        uVar16 = local_250 & 0xffffffff;
        if ((int)local_250 < 1) {
          uVar16 = uVar19;
        }
        iVar9 = 0;
        for (; uVar16 != uVar19; uVar19 = uVar19 + 1) {
          if (perm_r[uVar19] == -1) {
            perm_r[uVar19] = (int)local_218 + iVar9;
            iVar9 = iVar9 + 1;
          }
        }
      }
      ilu_countnz(local_244,&nnzL,&nnzU,Glu);
      fixupL(uVar18,perm_r,Glu);
      zLUWorkFree(iwork,zwork,Glu);
      superlu_free(xplore);
      superlu_free(local_190);
      if (local_1dc == SamePattern_SameRowPerm) {
        piVar2 = (int_t *)L->Store;
        *piVar2 = nnzL;
        piVar2[1] = Glu->supno[local_218];
        piVar3 = Glu->xlusup;
        *(void **)(piVar2 + 2) = Glu->lusup;
        *(int_t **)(piVar2 + 4) = piVar3;
        piVar3 = Glu->xlsub;
        *(int_t **)(piVar2 + 6) = Glu->lsub;
        *(int_t **)(piVar2 + 8) = piVar3;
        piVar2 = (int_t *)U->Store;
        *piVar2 = nnzU;
        piVar3 = Glu->usub;
        *(void **)(piVar2 + 2) = Glu->ucol;
        *(int_t **)(piVar2 + 4) = piVar3;
        *(int_t **)(piVar2 + 6) = Glu->xusub;
      }
      else {
        zCreate_SuperNode_Matrix
                  (L,pSVar5->nrow,uVar18,nnzL,(doublecomplex *)Glu->lusup,Glu->xlusup,Glu->lsub,
                   Glu->xlsub,Glu->supno,Glu->xsup,SLU_SC,SLU_Z,SLU_TRLU);
        zCreate_CompCol_Matrix
                  (U,uVar18,uVar18,nnzU,(doublecomplex *)Glu->ucol,Glu->usub,Glu->xusub,SLU_NC,SLU_Z
                   ,SLU_TRU);
      }
      local_a0[7] = local_a0[0x13] + local_a0[0x14] + local_a0[7];
      iVar9 = Glu->num_expansions + -1;
      Glu->num_expansions = iVar9;
      stat->expansions = iVar9;
      if (local_1dc == SamePattern_SameRowPerm) {
        superlu_free(local_188);
      }
      superlu_free(local_118);
      superlu_free(local_158);
      superlu_free(local_128);
      superlu_free(local_d8);
      superlu_free(local_a8);
      superlu_free(amax);
      if (local_1d0 == (double *)0x0) {
        return;
      }
      superlu_free(local_1d0);
      return;
    }
    piVar22 = (int *)(long)iVar9;
    iVar11 = local_158[(long)piVar22];
    local_268 = piVar21;
    if ((long)iVar11 == -1) break;
    iVar20 = iVar11 - iVar9;
    local_98[(long)iVar20 + 1] = local_98[(long)iVar20 + 1] + 1;
    local_1c8._0_4_ = iVar20;
    if ((0 < iVar9) && (iVar9 < local_1d8)) {
      uVar18 = iVar9 - 1;
      local_210 = (double)(int)local_284;
      iVar20 = local_148[local_138[uVar18]];
      lVar23 = (long)iVar20;
      local_1f0 = (int *)(double)(int)uVar18;
      if (bVar7 == 0) {
        iVar9 = (int)((double)(iVar9 - iVar20) *
                     (((double)((int)local_250 - iVar20) *
                      (((double)*local_230 * (double)CONCAT44(uVar28,uVar27)) / local_240)) /
                     local_240));
      }
      else {
        if (bVar14 == 0) {
          iVar9 = 0;
          for (; lVar23 < (long)piVar22; lVar23 = lVar23 + 1) {
            iVar9 = (iVar9 + xa_end[lVar23]) - local_200[lVar23];
          }
          dVar24 = ((double)((int)local_250 - iVar20) *
                   (double)iVar9 * (double)CONCAT44(uVar28,uVar27)) / local_240;
        }
        else {
          iVar9 = local_178;
          if (bVar13 != 0) goto LAB_0010a2ab;
          dVar24 = ((((double)local_1f0 + 1.0) * -0.5) / local_240 + 1.0) * local_260 * local_210 -
                   (double)nnzLj;
        }
        iVar9 = (int)dVar24;
      }
LAB_0010a2ab:
      local_208 = (int *)CONCAT44(local_208._4_4_,iVar9);
      fill_tol = pow(local_1c0,((double)(int)(iVar20 + uVar18) * -0.5) / local_120 + 1.0);
      ilu_zdrop_row(local_e8,iVar20,uVar18,local_238,(int)local_208,&nnzLj,&fill_tol,Glu,&tempv->r,
                    local_1d0,0);
      if ((local_1e0 & 1) == 0) {
        if ((double)nnzLj <=
            ((((double)local_1f0 + 1.0) * -0.5) / local_240 + 1.0) * local_210 * local_260) {
          dVar24 = local_238 * 0.5;
          local_238 = local_150;
          if (local_150 <= dVar24) {
            local_238 = dVar24;
          }
        }
        else {
          dVar24 = local_238 + local_238;
          local_238 = 1.0;
          if (dVar24 <= 1.0) {
            local_238 = dVar24;
          }
        }
      }
      dVar24 = fill_tol;
      if (0.0 <= fill_tol) {
        dVar24 = 0.0;
      }
      local_274 = local_274 - (int)dVar24;
    }
    iVar9 = ilu_zsnode_dfs((int)local_268,iVar11,piVar3,local_200,xa_end,marker,Glu);
    *info = iVar9;
    if (iVar9 != 0) {
      return;
    }
    iVar15 = (int)local_1c8 + 1;
    local_1c8 = CONCAT44(local_1c8._4_4_,local_d0[(long)piVar22]);
    iVar8 = local_e0[(long)piVar22];
    local_208 = (int *)(long)local_138[(long)piVar22];
    local_210 = (double)(long)local_148[(long)local_208];
    iVar9 = local_198[(long)local_210 + 1];
    iVar20 = local_198[(long)local_210];
    nzlumax = Glu->nzlumax;
    while (nzlumax < (iVar9 - iVar20) * iVar15 + iVar8) {
      iVar10 = zLUMemXpand((int)local_268,iVar8,LUSUP,&nzlumax,Glu);
      *info = iVar10;
      if (iVar10 != 0) {
        return;
      }
    }
    while ((long)piVar22 <= (long)iVar11) {
      local_268 = (int *)((long)piVar22 + 1);
      local_d0[(long)piVar22 + 1] = (int)local_1c8;
      *amax = 0.0;
      lVar23 = (long)local_200[(long)piVar22];
      z = (doublecomplex *)(lVar23 * 0x10 + local_40);
      for (; lVar23 < xa_end[(long)piVar22]; lVar23 = lVar23 + 1) {
        dVar24 = z_abs1(z);
        if (*amax <= dVar24 && dVar24 != *amax) {
          *amax = dVar24;
        }
        iVar9 = piVar3[lVar23];
        dVar24 = z->i;
        dense[iVar9].r = z->r;
        dense[iVar9].i = dVar24;
        z = z + 1;
      }
      local_284 = (xa_end[(long)piVar22] + local_284) - local_200[(long)piVar22];
      if ((*amax == 0.0) && (!NAN(*amax))) {
        *amax = local_1c0;
      }
      iVar9 = (int)piVar22;
      zsnode_bmod(iVar9,(int)local_208,SUB84(local_210,0),dense,tempv,Glu,stat);
      if (usepr != 0) {
        pivrow = local_188[(long)piVar22];
      }
      fill_tol = pow(local_1c0,1.0 - (double)iVar9 / local_120);
      iVar9 = ilu_zpivotL(iVar9,local_90,&usepr,perm_r,local_118[(long)piVar22],local_128,local_d8,
                          local_190,&pivrow,fill_tol * *amax,(milu_t)local_110,
                          (doublecomplex)ZEXT816(0),Glu,stat);
      *info = iVar9;
      piVar22 = local_268;
      if (iVar9 != 0) {
        local_274 = local_274 + 1;
        marker[pivrow] = iVar11;
      }
    }
    piVar21 = (int *)(ulong)(iVar11 + 1);
    uVar27 = SUB84(local_260,0);
    uVar28 = (undefined4)((ulong)local_260 >> 0x20);
  }
  uVar18 = (int)local_140 + iVar9;
  if ((int)local_244 <= (int)uVar18) {
    uVar18 = local_244;
  }
  uVar16 = 0;
  do {
    if ((long)(int)uVar18 <= (long)((long)iVar9 + 1 + uVar16)) {
      uVar18 = iVar9 + (int)uVar16 + 1;
      uVar19 = local_140;
      goto LAB_0010a770;
    }
    uVar19 = uVar16 + 1;
    lVar23 = (long)iVar9 + uVar16;
    uVar16 = uVar19;
  } while (local_60[lVar23] == -1);
  uVar18 = iVar9 + (int)uVar19;
LAB_0010a770:
  iVar11 = (int)uVar19;
  if (uVar18 == local_244) {
    iVar11 = local_244 - iVar9;
  }
  local_168 = (int *)(long)iVar11;
  local_98[(long)local_168] = local_98[(long)local_168] + 1;
  ilu_zpanel_dfs((int)local_250,iVar11,iVar9,local_c0,perm_r,&nseg1,dense,amax,panel_lsub,segrep,
                 repfnz,marker,parent,xplore,Glu);
  zpanel_bmod((int)local_250,(int)local_168,(int)local_268,nseg1,dense,tempv,segrep,repfnz,Glu,stat)
  ;
  uVar18 = (int)local_168 + (int)local_268;
  local_168 = (int *)(ulong)uVar18;
  local_68 = (long)(int)uVar18;
  uVar27 = SUB84(local_260,0);
  uVar28 = (undefined4)((ulong)local_260 >> 0x20);
  piVar17 = piVar22;
  do {
    uVar16 = (ulong)local_284;
    do {
      do {
        jcol = (uint)piVar17;
        uVar18 = jcol;
        if ((int)jcol < (int)n) {
          uVar18 = n;
        }
        piVar21 = local_168;
        if (local_68 <= (long)piVar17) goto LAB_0010a129;
        local_1f0 = (int *)CONCAT44(local_1f0._4_4_,uVar18);
        local_1c8 = (long)piVar17 - (long)piVar22;
        lVar23 = local_1c8 * local_f0;
        nseg = nseg1;
        iVar9 = xa_end[(long)piVar17];
        iVar11 = local_200[(long)piVar17];
        local_210 = (double)uVar16;
        iVar20 = ilu_zcolumn_dfs((int)local_250,jcol,perm_r,&nseg,panel_lsub + lVar23,segrep,
                                 repfnz + lVar23,marker,parent,xplore,Glu);
        *info = iVar20;
        if (iVar20 != 0) {
          return;
        }
        iVar20 = zcolumn_bmod(jcol,nseg - nseg1,dense + lVar23,tempv,segrep + nseg1,repfnz + lVar23,
                              (int)local_268,Glu,stat);
        lVar6 = local_50;
        piVar21 = marker;
        *info = iVar20;
        if (iVar20 != 0) {
          return;
        }
        uVar27 = SUB84(local_260,0);
        uVar28 = (undefined4)((ulong)local_260 >> 0x20);
        local_208 = piVar17;
        if (local_198[(long)piVar17 + 1] == local_198[(long)piVar17]) {
          nnzL = Glu->nzlmax;
          if (nnzL <= local_198[(long)piVar17] + 1) {
            iVar8 = zLUMemXpand(jcol,local_198[(long)piVar17] + 1,LSUB,&nnzL,Glu);
            uVar27 = SUB84(local_260,0);
            uVar28 = (undefined4)((ulong)local_260 >> 0x20);
            if (iVar8 != 0) {
              *info = iVar8;
              return;
            }
          }
          piVar2 = Glu->lsub;
          local_198[(long)local_208 + 1] = local_198[(long)local_208 + 1] + 1;
          iVar20 = local_e0[(long)local_208];
          if (iVar20 != local_e0[(long)local_208 + 1]) {
            __assert_fail("xlusup[jj]==xlusup[jj+1]",
                          "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zgsitrf.c"
                          ,0x1f5,
                          "void zgsitrf(superlu_options_t *, SuperMatrix *, int, int, int *, void *, int_t, int *, int *, SuperMatrix *, SuperMatrix *, GlobalLU_t *, SuperLUStat_t *, int_t *)"
                         );
          }
          local_e0[(long)local_208 + 1] = iVar20 + 1;
          puVar1 = (undefined8 *)((long)Glu->lusup + (long)iVar20 * 0x10);
          *puVar1 = 0;
          puVar1[1] = 0;
          for (piVar17 = local_208; (long)piVar17 < (long)local_218;
              piVar17 = (int *)((long)piVar17 + 1)) {
            if ((long)local_190[local_128[(long)piVar17]] <= (long)local_208) goto LAB_0010aaaa;
          }
          piVar17 = (int *)((ulong)local_1f0 & 0xffffffff);
LAB_0010aaaa:
          iVar20 = local_128[(int)piVar17];
          piVar21[lVar6 + iVar20] = (int)local_208;
          piVar2[local_198[(long)local_208]] = iVar20;
        }
        local_284 = (iVar9 - iVar11) + local_210._0_4_;
        local_210 = (double)(int)local_208;
        local_1f0 = (int *)((long)local_208 + 1);
        local_160 = (double)(int)local_284;
        if (bVar7 == 0) {
          uVar16 = (ulong)(uint)(int)(((((double)*local_230 * (double)CONCAT44(uVar28,uVar27)) /
                                       local_240) * local_210) / local_240);
        }
        else if (bVar14 == 0) {
          uVar16 = (ulong)(uint)(int)(((double)(int)local_1f0 *
                                      (double)(xa_end[(long)local_208] - local_200[(long)local_208])
                                      * (double)CONCAT44(uVar28,uVar27)) / local_240);
        }
        else {
          uVar16 = local_250;
          if (bVar13 == 0) {
            uVar16 = (ulong)(uint)(int)(local_b8 * local_160 * 0.5 - (double)nnzUj);
          }
        }
        iVar9 = ilu_zcopy_to_ucol((int)local_208,nseg,segrep,repfnz + lVar23,perm_r,dense + lVar23,
                                  (int)local_130,(milu_t)local_110,amax[local_1c8] * local_1a0,
                                  (int)uVar16,&local_108,&nnzUj,Glu,local_1d0);
        *info = iVar9;
        if (iVar9 != 0) {
          return;
        }
        if ((local_1e0 & 1) == 0) {
          if ((double)nnzLj <= local_b8 * local_160 * 0.5) {
            dVar24 = local_1a0 * 0.5;
            local_1a0 = local_150;
            if (local_150 <= dVar24) {
              local_1a0 = dVar24;
            }
          }
          else {
            dVar24 = local_1a0 + local_1a0;
            local_1a0 = 1.0;
            if (dVar24 <= 1.0) {
              local_1a0 = dVar24;
            }
          }
        }
        if ((local_108.r != 0.0) || (NAN(local_108.r))) {
LAB_0010ad1f:
          dVar25 = z_abs1(&local_108);
          dVar24 = 1.0;
          if (local_b0 / dVar25 < 1.0) {
            dVar24 = z_abs1(&local_108);
            dVar24 = local_b0 / dVar24;
          }
          dVar25 = dVar24 * local_108.i;
          local_108.i._0_4_ = SUB84(dVar25,0);
          local_108.r = dVar24 * local_108.r;
          local_108.i._4_4_ = (int)((ulong)dVar25 >> 0x20);
        }
        else if ((local_108.i != 0.0) || (NAN(local_108.i))) goto LAB_0010ad1f;
        piVar21 = local_208;
        if (usepr != 0) {
          pivrow = local_188[(long)local_208];
        }
        fill_tol = pow(local_1c0,1.0 - local_210 / local_120);
        iVar11 = (int)piVar21;
        iVar9 = ilu_zpivotL(iVar11,local_90,&usepr,perm_r,local_118[(long)piVar21],local_128,
                            local_d8,local_190,&pivrow,fill_tol * amax[local_1c8],(milu_t)local_110,
                            local_108,Glu,stat);
        uVar19 = local_250;
        *info = iVar9;
        if (iVar9 != 0) {
          local_274 = local_274 + 1;
          marker[pivrow + local_f0] = iVar11;
          marker[pivrow + local_48] = iVar11;
        }
        resetrep_col(nseg,segrep,repfnz + lVar23);
        uVar16 = (ulong)local_284;
        uVar27 = SUB84(local_260,0);
        uVar28 = (undefined4)((ulong)local_260 >> 0x20);
        piVar17 = local_1f0;
      } while ((long)piVar21 < 1);
      uVar16 = (ulong)local_284;
    } while ((local_138[(long)piVar21] <= local_138[(long)piVar21 - 1]) ||
            (uVar16 = (ulong)local_284, local_58 <= (long)piVar21));
    iVar20 = iVar11 + -1;
    iVar9 = local_148[local_138[(long)piVar21 - 1]];
    lVar23 = (long)iVar9;
    if (bVar7 == 0) {
      dVar24 = (double)(iVar11 - iVar9) *
               (((double)((int)uVar19 - iVar9) * (((double)*local_230 * local_260) / local_240)) /
               local_240);
LAB_0010aff0:
      iVar11 = (int)dVar24;
    }
    else {
      if (bVar14 == 0) {
        iVar11 = 0;
        for (; lVar23 < (long)piVar21; lVar23 = lVar23 + 1) {
          iVar11 = (iVar11 + xa_end[lVar23]) - local_200[lVar23];
        }
        dVar24 = ((double)((int)uVar19 - iVar9) * (double)iVar11 * local_260) / local_240;
        goto LAB_0010aff0;
      }
      iVar11 = local_178;
      if (bVar13 == 0) {
        iVar11 = (int)(((((double)iVar20 + 1.0) * -0.5) / local_240 + 1.0) * local_260 * local_160 -
                      (double)nnzLj);
      }
    }
    fill_tol = pow(local_1c0,((double)(iVar9 + iVar20) * -0.5) / local_120 + 1.0);
    ilu_zdrop_row(local_e8,iVar9,iVar20,local_238,iVar11,&nnzLj,&fill_tol,Glu,&tempv->r,local_1d0,1)
    ;
    uVar28 = (undefined4)((ulong)local_260 >> 0x20);
    if ((local_1e0 & 1) == 0) {
      if ((double)nnzLj <=
          ((((double)iVar20 + 1.0) * -0.5) / local_240 + 1.0) * local_160 * local_260) {
        dVar24 = local_238 * 0.5;
        local_238 = local_150;
        if (local_150 <= dVar24) {
          local_238 = dVar24;
        }
      }
      else {
        dVar24 = local_238 + local_238;
        local_238 = 1.0;
        if (dVar24 <= 1.0) {
          local_238 = dVar24;
        }
      }
    }
    uVar27 = SUB84(local_260,0);
    dVar24 = fill_tol;
    if (0.0 <= fill_tol) {
      dVar24 = 0.0;
    }
    local_274 = local_274 - (int)dVar24;
    piVar17 = local_1f0;
  } while( true );
}

Assistant:

void
zgsitrf(superlu_options_t *options, SuperMatrix *A, int relax, int panel_size,
	int *etree, void *work, int_t lwork, int *perm_c, int *perm_r,
	SuperMatrix *L, SuperMatrix *U, 
    	GlobalLU_t *Glu, /* persistent to facilitate multiple factorizations */
	SuperLUStat_t *stat, int_t *info)
{
    /* Local working arrays */
    NCPformat *Astore;
    int       *iperm_r = NULL; /* inverse of perm_r; used when
				  options->Fact == SamePattern_SameRowPerm */
    int       *iperm_c; /* inverse of perm_c */
    int       *swap, *iswap; /* swap is used to store the row permutation
				during the factorization. Initially, it is set
				to iperm_c (row indices of Pc*A*Pc').
				iswap is the inverse of swap. After the
				factorization, it is equal to perm_r. */
    int       *iwork;
    doublecomplex   *zwork;
    int       *segrep, *repfnz, *parent;
    int_t     *xplore;
    int       *panel_lsub; /* dense[]/panel_lsub[] pair forms a w-wide SPA */
    int       *marker;
    int       *marker_relax;
    doublecomplex    *dense, *tempv;
    double *dtempv;
    int       *relax_end, *relax_fsupc;
    doublecomplex    *a;
    int_t     *asub;
    int_t     *xa_begin, *xa_end;
    int       *xsup, *supno;
    int_t     *xlsub, *xlusup, *xusub;
    int_t     nzlumax;
    double    *amax; 
    doublecomplex    drop_sum;
    double alpha, omega;  /* used in MILU, mimicking DRIC */
    double    *dwork2;	   /* used by the second dropping rule */

    /* Local scalars */
    fact_t    fact = options->Fact;
    double    diag_pivot_thresh = options->DiagPivotThresh;
    double    drop_tol = options->ILU_DropTol; /* tau */
    double    fill_ini = options->ILU_FillTol; /* tau^hat */
    double    gamma = options->ILU_FillFactor;
    int       drop_rule = options->ILU_DropRule;
    milu_t    milu = options->ILU_MILU;
    double    fill_tol;
    int       pivrow;	/* pivotal row number in the original matrix A */
    int       nseg1;	/* no of segments in U-column above panel row jcol */
    int       nseg;	/* no of segments in each U-column */
    register int jcol, jj;
    register int kcol;	/* end column of a relaxed snode */
    register int icol;
    int_t     i, k, iinfo;
    int       m, n, min_mn, jsupno, fsupc;
    int_t     new_next, nextlu, nextu;
    int       w_def;	/* upper bound on panel width */
    int       usepr, iperm_r_allocated = 0;
    int_t     nnzL, nnzU;
    int       *panel_histo = stat->panel_histo;
    flops_t   *ops = stat->ops;

    int       last_drop;/* the last column which the dropping rules applied */
    int       quota;
    int       nnzAj;	/* number of nonzeros in A(:,1:j) */
    int       nnzLj, nnzUj;
    double    tol_L = drop_tol, tol_U = drop_tol;
    doublecomplex zero = {0.0, 0.0};
    double one = 1.0;

    /* Executable */	   
    iinfo    = 0;
    m	     = A->nrow;
    n	     = A->ncol;
    min_mn   = SUPERLU_MIN(m, n);
    Astore   = A->Store;
    a	     = Astore->nzval;
    asub     = Astore->rowind;
    xa_begin = Astore->colbeg;
    xa_end   = Astore->colend;

    /* Allocate storage common to the factor routines */
    *info = zLUMemInit(fact, work, lwork, m, n, Astore->nnz, panel_size,
		       gamma, L, U, Glu, &iwork, &zwork);
    if ( *info ) return;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    xlsub   = Glu->xlsub;
    xlusup  = Glu->xlusup;
    xusub   = Glu->xusub;

    int_t *xprune;
    SetIWork(m, n, panel_size, iwork, &segrep, &parent, &xplore,
	     &repfnz, &panel_lsub, &xprune, &marker);
    marker_relax = int32Malloc(m);
    SUPERLU_FREE(xprune); /* not used in ILU */
    
    zSetRWork(m, panel_size, zwork, &dense, &tempv);

    usepr = (fact == SamePattern_SameRowPerm);
    if ( usepr ) {
	/* Compute the inverse of perm_r */
	iperm_r = (int *) int32Malloc(m);
	for (k = 0; k < m; ++k) iperm_r[perm_r[k]] = k;
	iperm_r_allocated = 1;
    }

    iperm_c = (int *) int32Malloc(n);
    for (k = 0; k < n; ++k) iperm_c[perm_c[k]] = k;
    swap = (int *)intMalloc(n);
    for (k = 0; k < n; k++) swap[k] = iperm_c[k];
    iswap = (int *)intMalloc(n);
    for (k = 0; k < n; k++) iswap[k] = perm_c[k];
    amax = (double *) SUPERLU_MALLOC(panel_size * sizeof(double));
    if (drop_rule & DROP_SECONDARY)
	dwork2 = SUPERLU_MALLOC(n * sizeof(double));
    else
	dwork2 = NULL;

    nnzAj = 0;
    nnzLj = 0;
    nnzUj = 0;
    last_drop = SUPERLU_MAX(min_mn - 2 * sp_ienv(7), (int)(min_mn * 0.95));
    alpha = pow((double)n, -1.0 / options->ILU_MILU_Dim);

    /* Identify relaxed snodes */
    relax_end = (int *) intMalloc(n);
    relax_fsupc = (int *) intMalloc(n);
    if ( options->SymmetricMode == YES )
	ilu_heap_relax_snode(n, etree, relax, marker, relax_end, relax_fsupc);
    else
	ilu_relax_snode(n, etree, relax, marker, relax_end, relax_fsupc);

    ifill (perm_r, m, SLU_EMPTY);
    ifill (marker, m * NO_MARKER, SLU_EMPTY);
    supno[0] = -1;
    xsup[0]  = xlsub[0] = xusub[0] = xlusup[0] = 0;
    w_def    = panel_size;

    /* Mark the rows used by relaxed supernodes */
    ifill (marker_relax, m, SLU_EMPTY);
    i = mark_relax(m, relax_end, relax_fsupc, xa_begin, xa_end,
	         asub, marker_relax);
#if ( PRNTlevel >= 1)
    printf("%d relaxed supernodes.\n", (int)i);
#endif

    /*
     * Work on one "panel" at a time. A panel is one of the following:
     *	   (a) a relaxed supernode at the bottom of the etree, or
     *	   (b) panel_size contiguous columns, defined by the user
     */
    for (jcol = 0; jcol < min_mn; ) {

	if ( relax_end[jcol] != SLU_EMPTY ) { /* start of a relaxed snode */
	    kcol = relax_end[jcol];	  /* end of the relaxed snode */
	    panel_histo[kcol-jcol+1]++;

	    /* Drop small rows in the previous supernode. */
	    if (jcol > 0 && jcol < last_drop) {
		int first = xsup[supno[jcol - 1]];
		int last = jcol - 1;
		int quota;

		/* Compute the quota */
		if (drop_rule & DROP_PROWS)
		    quota = gamma * Astore->nnz / m * (m - first) / m
			    * (last - first + 1);
		else if (drop_rule & DROP_COLUMN) {
		    int i;
		    quota = 0;
		    for (i = first; i <= last; i++)
			quota += xa_end[i] - xa_begin[i];
		    quota = gamma * quota * (m - first) / m;
		} else if (drop_rule & DROP_AREA)
		    quota = gamma * nnzAj * (1.0 - 0.5 * (last + 1.0) / m)
			    - nnzLj;
		else
		    quota = m * n;
		fill_tol = pow(fill_ini, 1.0 - 0.5 * (first + last) / min_mn);

		/* Drop small rows */
                dtempv = (double *) tempv;
		i = ilu_zdrop_row(options, first, last, tol_L, quota, &nnzLj,
				  &fill_tol, Glu, dtempv, dwork2, 0);
		/* Reset the parameters */
		if (drop_rule & DROP_DYNAMIC) {
		    if (gamma * nnzAj * (1.0 - 0.5 * (last + 1.0) / m)
			     < nnzLj)
			tol_L = SUPERLU_MIN(1.0, tol_L * 2.0);
		    else
			tol_L = SUPERLU_MAX(drop_tol, tol_L * 0.5);
		}
		if (fill_tol < 0) iinfo -= (int)fill_tol;
#ifdef DEBUG
		num_drop_L += i * (last - first + 1);
#endif
	    }

	    /* --------------------------------------
	     * Factorize the relaxed supernode(jcol:kcol)
	     * -------------------------------------- */
	    /* Determine the union of the row structure of the snode */
	    if ( (*info = ilu_zsnode_dfs(jcol, kcol, asub, xa_begin, xa_end,
					 marker, Glu)) != 0 )
		return;

	    nextu    = xusub[jcol];
	    nextlu   = xlusup[jcol];
	    jsupno   = supno[jcol];
	    fsupc    = xsup[jsupno];
	    new_next = nextlu + (xlsub[fsupc+1]-xlsub[fsupc])*(kcol-jcol+1);
	    nzlumax = Glu->nzlumax;
	    while ( new_next > nzlumax ) {
		if ((*info = zLUMemXpand(jcol, nextlu, LUSUP, &nzlumax, Glu)))
		    return;
	    }

	    for (icol = jcol; icol <= kcol; icol++) {
		xusub[icol+1] = nextu;

		amax[0] = 0.0;
		/* Scatter into SPA dense[*] */
		for (k = xa_begin[icol]; k < xa_end[icol]; k++) {
                    register double tmp = z_abs1 (&a[k]);
		    if (tmp > amax[0]) amax[0] = tmp;
		    dense[asub[k]] = a[k];
		}
		nnzAj += xa_end[icol] - xa_begin[icol];
		if (amax[0] == 0.0) {
		    amax[0] = fill_ini;
#if ( PRNTlevel >= 1)
		    printf("Column %d is entirely zero!\n", icol);
		    fflush(stdout);
#endif
		}

		/* Numeric update within the snode */
		zsnode_bmod(icol, jsupno, fsupc, dense, tempv, Glu, stat);

		if (usepr) pivrow = iperm_r[icol];
		fill_tol = pow(fill_ini, 1.0 - (double)icol / (double)min_mn);
		if ( (*info = ilu_zpivotL(icol, diag_pivot_thresh, &usepr,
					  perm_r, iperm_c[icol], swap, iswap,
					  marker_relax, &pivrow,
                                          amax[0] * fill_tol, milu, zero,
                                          Glu, stat)) ) {
		    iinfo++;
		    marker[pivrow] = kcol;
		}

	    }

	    jcol = kcol + 1;

	} else { /* Work on one panel of panel_size columns */

	    /* Adjust panel_size so that a panel won't overlap with the next
	     * relaxed snode.
	     */
	    panel_size = w_def;
	    for (k = jcol + 1; k < SUPERLU_MIN(jcol+panel_size, min_mn); k++)
		if ( relax_end[k] != SLU_EMPTY ) {
		    panel_size = k - jcol;
		    break;
		}
	    if ( k == min_mn ) panel_size = min_mn - jcol;
	    panel_histo[panel_size]++;

	    /* symbolic factor on a panel of columns */
	    ilu_zpanel_dfs(m, panel_size, jcol, A, perm_r, &nseg1,
                          dense, amax, panel_lsub, segrep, repfnz,
                          marker, parent, xplore, Glu);

	    /* numeric sup-panel updates in topological order */
	    zpanel_bmod(m, panel_size, jcol, nseg1, dense,
			tempv, segrep, repfnz, Glu, stat);

	    /* Sparse LU within the panel, and below panel diagonal */
	    for (jj = jcol; jj < jcol + panel_size; jj++) {

		k = (jj - jcol) * m; /* column index for w-wide arrays */

		nseg = nseg1;	/* Begin after all the panel segments */

		nnzAj += xa_end[jj] - xa_begin[jj];

		if ((*info = ilu_zcolumn_dfs(m, jj, perm_r, &nseg,
					     &panel_lsub[k], segrep, &repfnz[k],
					     marker, parent, xplore, Glu)))
		    return;

		/* Numeric updates */
		if ((*info = zcolumn_bmod(jj, (nseg - nseg1), &dense[k],
					  tempv, &segrep[nseg1], &repfnz[k],
					  jcol, Glu, stat)) != 0) return;

		/* Make a fill-in position if the column is entirely zero */
		if (xlsub[jj + 1] == xlsub[jj]) {
		    register int i, row;
		    int_t nextl;
		    int_t nzlmax = Glu->nzlmax;
		    int_t *lsub = Glu->lsub;
		    int *marker2 = marker + 2 * m;

		    /* Allocate memory */
		    nextl = xlsub[jj] + 1;
		    if (nextl >= nzlmax) {
			int error = zLUMemXpand(jj, nextl, LSUB, &nzlmax, Glu);
			if (error) { *info = error; return; }
			lsub = Glu->lsub;
		    }
		    xlsub[jj + 1]++;
		    assert(xlusup[jj]==xlusup[jj+1]);
		    xlusup[jj + 1]++;
		    ((doublecomplex *) Glu->lusup)[xlusup[jj]] = zero;

		    /* Choose a row index (pivrow) for fill-in */
		    for (i = jj; i < n; i++)
			if (marker_relax[swap[i]] <= jj) break;
		    row = swap[i];
		    marker2[row] = jj;
		    lsub[xlsub[jj]] = row;
#ifdef DEBUG
		    printf("Fill col %d.\n", (int)jj);
		    fflush(stdout);
#endif
		}

		/* Computer the quota */
		if (drop_rule & DROP_PROWS)
		    quota = gamma * Astore->nnz / m * jj / m;
		else if (drop_rule & DROP_COLUMN)
		    quota = gamma * (xa_end[jj] - xa_begin[jj]) *
			    (jj + 1) / m;
		else if (drop_rule & DROP_AREA)
		    quota = gamma * 0.9 * nnzAj * 0.5 - nnzUj;
		else
		    quota = m;

		/* Copy the U-segments to ucol[*] and drop small entries */
		if ((*info = ilu_zcopy_to_ucol(jj, nseg, segrep, &repfnz[k],
					       perm_r, &dense[k], drop_rule,
					       milu, amax[jj - jcol] * tol_U,
					       quota, &drop_sum, &nnzUj, Glu,
					       dwork2)) != 0)
		    return;

		/* Reset the dropping threshold if required */
		if (drop_rule & DROP_DYNAMIC) {
		    if (gamma * 0.9 * nnzAj * 0.5 < nnzLj)
			tol_U = SUPERLU_MIN(1.0, tol_U * 2.0);
		    else
			tol_U = SUPERLU_MAX(drop_tol, tol_U * 0.5);
		}

		if (drop_sum.r != 0.0 || drop_sum.i != 0.0)
		{
                    omega = SUPERLU_MIN(2.0*(1.0-alpha)/z_abs1(&drop_sum), 1.0);
                    zd_mult(&drop_sum, &drop_sum, omega);
		}
		if (usepr) pivrow = iperm_r[jj];
		fill_tol = pow(fill_ini, 1.0 - (double)jj / (double)min_mn);
		if ( (*info = ilu_zpivotL(jj, diag_pivot_thresh, &usepr, perm_r,
					  iperm_c[jj], swap, iswap,
					  marker_relax, &pivrow,
					  amax[jj - jcol] * fill_tol, milu,
					  drop_sum, Glu, stat)) ) {
		    iinfo++;
		    marker[m + pivrow] = jj;
		    marker[2 * m + pivrow] = jj;
		}

		/* Reset repfnz[] for this column */
		resetrep_col (nseg, segrep, &repfnz[k]);

		/* Start a new supernode, drop the previous one */
		if (jj > 0 && supno[jj] > supno[jj - 1] && jj < last_drop) {
		    int first = xsup[supno[jj - 1]];
		    int last = jj - 1;
		    int quota;

		    /* Compute the quota */
		    if (drop_rule & DROP_PROWS)
			quota = gamma * Astore->nnz / m * (m - first) / m
				* (last - first + 1);
		    else if (drop_rule & DROP_COLUMN) {
			int i;
			quota = 0;
			for (i = first; i <= last; i++)
			    quota += xa_end[i] - xa_begin[i];
			quota = gamma * quota * (m - first) / m;
		    } else if (drop_rule & DROP_AREA)
			quota = gamma * nnzAj * (1.0 - 0.5 * (last + 1.0)
				/ m) - nnzLj;
		    else
			quota = m * n;
		    fill_tol = pow(fill_ini, 1.0 - 0.5 * (first + last) /
			    (double)min_mn);

		    /* Drop small rows */
                    dtempv = (double *) tempv;
		    i = ilu_zdrop_row(options, first, last, tol_L, quota,
				      &nnzLj, &fill_tol, Glu, dtempv, dwork2,
				      1);

		    /* Reset the parameters */
		    if (drop_rule & DROP_DYNAMIC) {
			if (gamma * nnzAj * (1.0 - 0.5 * (last + 1.0) / m)
				< nnzLj)
			    tol_L = SUPERLU_MIN(1.0, tol_L * 2.0);
			else
			    tol_L = SUPERLU_MAX(drop_tol, tol_L * 0.5);
		    }
		    if (fill_tol < 0) iinfo -= (int)fill_tol;
#ifdef DEBUG
		    num_drop_L += i * (last - first + 1);
#endif
		} /* if start a new supernode */

	    } /* for */

	    jcol += panel_size; /* Move to the next panel */

	} /* else */

    } /* for */

    *info = iinfo;

    if ( m > n ) {
	k = 0;
	for (i = 0; i < m; ++i)
	    if ( perm_r[i] == SLU_EMPTY ) {
		perm_r[i] = n + k;
		++k;
	    }
    }

    ilu_countnz(min_mn, &nnzL, &nnzU, Glu);
    fixupL(min_mn, perm_r, Glu);

    zLUWorkFree(iwork, zwork, Glu); /* Free work space and compress storage */
    SUPERLU_FREE (xplore);
    SUPERLU_FREE (marker_relax);

    if ( fact == SamePattern_SameRowPerm ) {
	/* L and U structures may have changed due to possibly different
	   pivoting, even though the storage is available.
	   There could also be memory expansions, so the array locations
	   may have changed, */
	((SCformat *)L->Store)->nnz = nnzL;
	((SCformat *)L->Store)->nsuper = Glu->supno[n];
	((SCformat *)L->Store)->nzval = (doublecomplex *) Glu->lusup;
	((SCformat *)L->Store)->nzval_colptr = Glu->xlusup;
	((SCformat *)L->Store)->rowind = Glu->lsub;
	((SCformat *)L->Store)->rowind_colptr = Glu->xlsub;
	((NCformat *)U->Store)->nnz = nnzU;
	((NCformat *)U->Store)->nzval = (doublecomplex *) Glu->ucol;
	((NCformat *)U->Store)->rowind = Glu->usub;
	((NCformat *)U->Store)->colptr = Glu->xusub;
    } else {
	zCreate_SuperNode_Matrix(L, A->nrow, min_mn, nnzL,
              (doublecomplex *) Glu->lusup, Glu->xlusup,
              Glu->lsub, Glu->xlsub, Glu->supno, Glu->xsup,
	      SLU_SC, SLU_Z, SLU_TRLU);
	zCreate_CompCol_Matrix(U, min_mn, min_mn, nnzU,
	      (doublecomplex *) Glu->ucol, Glu->usub, Glu->xusub,
	      SLU_NC, SLU_Z, SLU_TRU);
    }

    ops[FACT] += ops[TRSV] + ops[GEMV];
    stat->expansions = --(Glu->num_expansions);

    if ( iperm_r_allocated ) SUPERLU_FREE (iperm_r);
    SUPERLU_FREE (iperm_c);
    SUPERLU_FREE (relax_end);
    SUPERLU_FREE (swap);
    SUPERLU_FREE (iswap);
    SUPERLU_FREE (relax_fsupc);
    SUPERLU_FREE (amax);
    if ( dwork2 ) SUPERLU_FREE (dwork2);

}